

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O2

void __thiscall ProblemTest_MutAlgebraicCon_Test::TestBody(ProblemTest_MutAlgebraicCon_Test *this)

{
  undefined8 *puVar1;
  double dVar2;
  undefined8 uVar3;
  pointer pdVar4;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *actual;
  char *pcVar5;
  int *expected;
  int i;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  MutAlgebraicCon MVar9;
  AssertHelper local_3d8;
  AssertHelper local_3d0;
  AssertionResult gtest_ar_1;
  NumericConstant expr;
  double coefs [1];
  AssertionResult gtest_ar;
  AssertHelper local_398;
  int num_terms;
  int indices [1];
  Problem p;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&p);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon(&p,0.0,0.0);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0;
  expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ =
       (int)(((long)p.algebraic_cons_.
                    super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)p.algebraic_cons_.
                   super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x88);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"1","p.num_algebraic_cons()",(int *)&gtest_ar_1,(int *)&expr);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,(int)gtest_ar.message_.ptr_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&expr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x191,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&expr,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&expr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  MVar9 = mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(&p,0);
  gtest_ar._0_8_ =
       MVar9.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  coefs[0] = (double)((ulong)coefs[0]._4_4_ << 0x20);
  gtest_ar.message_.ptr_._0_4_ =
       MVar9.
       super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  pdVar4 = (((BasicProblem<mp::BasicProblemParams<int>_> *)gtest_ar._0_8_)->initial_dual_values_).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar7 = 0;
  uVar8 = 0;
  if ((ulong)(long)(int)gtest_ar.message_.ptr_ <
      (ulong)((long)(((BasicProblem<mp::BasicProblemParams<int>_> *)gtest_ar._0_8_)->
                    initial_dual_values_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pdVar4 >> 3)) {
    dVar2 = pdVar4[(int)gtest_ar.message_.ptr_];
    uVar7 = SUB84(dVar2,0);
    uVar8 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._4_4_ = uVar8;
  expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_._0_4_ = uVar7;
  testing::internal::CmpHelperEQ<int,double>
            ((internal *)&gtest_ar_1,"0","con.dual()",(int *)coefs,(double *)&expr);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&expr);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)coefs,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x193,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)coefs,(Message *)&expr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)coefs);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_dual
            ((MutAlgebraicCon *)&gtest_ar,4.2);
  expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_ =
       (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>)(ExprBase)0x4010cccccccccccd;
  uVar7 = 0;
  uVar8 = 0;
  if ((ulong)(long)(int)gtest_ar.message_.ptr_ <
      (ulong)(*(long *)(gtest_ar._0_8_ + 0x330) - *(long *)(gtest_ar._0_8_ + 0x328) >> 3)) {
    uVar3 = *(undefined8 *)
             (*(long *)(gtest_ar._0_8_ + 0x328) + (long)(int)gtest_ar.message_.ptr_ * 8);
    uVar7 = (undefined4)uVar3;
    uVar8 = (undefined4)((ulong)uVar3 >> 0x20);
  }
  coefs[0] = (double)CONCAT44(uVar8,uVar7);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_1,"4.2","con.dual()",(double *)&expr,coefs);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&expr);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)coefs,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x195,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)coefs,(Message *)&expr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)coefs);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&expr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(&p.super_ExprFactory,42.0)
  ;
  mp::BasicProblem<mp::BasicProblemParams<int>_>::MutAlgebraicCon::set_nonlinear_expr
            ((MutAlgebraicCon *)&gtest_ar,
             (NumericExpr)
             expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  if ((ulong)(long)(int)gtest_ar.message_.ptr_ <
      (ulong)(*(long *)(gtest_ar._0_8_ + 0x248) - *(long *)(gtest_ar._0_8_ + 0x240) >> 3)) {
    coefs[0] = *(double *)
                (*(long *)(gtest_ar._0_8_ + 0x240) + (long)(int)gtest_ar.message_.ptr_ * 8);
  }
  else {
    coefs[0] = 0.0;
  }
  actual = (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)coefs;
  testing::internal::
  CmpHelperEQ<mp::NumericConstant,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((internal *)&gtest_ar_1,"expr","con.nonlinear_expr()",&expr,actual);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)coefs);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x198,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d0,(Message *)coefs);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)coefs);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  mp::LinearExpr::AddTerm
            ((LinearExpr *)
             ((long)(int)gtest_ar.message_.ptr_ * 0x88 + *(long *)(gtest_ar._0_8_ + 0x228)),0xb,2.2)
  ;
  indices[0] = 0xb;
  coefs[0] = 2.2;
  lVar6 = *(long *)(gtest_ar._0_8_ + 0x228);
  puVar1 = (undefined8 *)(lVar6 + 0x78 + (long)(int)gtest_ar.message_.ptr_ * 0x88);
  *puVar1 = 0x400a666666666666;
  puVar1[1] = 0x401199999999999a;
  local_3d0.data_ = (AssertHelperData *)0x400a666666666666;
  local_3d8.data_ = *(AssertHelperData **)(lVar6 + 0x78 + (long)(int)gtest_ar.message_.ptr_ * 0x88);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_1,"3.3","con.lb()",(double *)&local_3d0,(double *)&local_3d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x19e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_3d0.data_ = (AssertHelperData *)0x401199999999999a;
  local_3d8.data_ =
       *(AssertHelperData **)
        (*(long *)(gtest_ar._0_8_ + 0x228) + 0x80 + (long)(int)gtest_ar.message_.ptr_ * 0x88);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_1,"4.4","con.ub()",(double *)&local_3d0,(double *)&local_3d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x19f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  num_terms = 1;
  local_3d0.data_._0_4_ =
       *(undefined4 *)
        (*(long *)(gtest_ar._0_8_ + 0x228) + 0x10 + (long)(int)gtest_ar.message_.ptr_ * 0x88);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"num_terms","con.linear_expr().num_terms()",&num_terms,
             (int *)&local_3d0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_3d0.data_ =
       *(AssertHelperData **)
        (*(long *)(gtest_ar._0_8_ + 0x228) + (long)(int)gtest_ar.message_.ptr_ * 0x88);
  expected = indices;
  for (lVar6 = 0; lVar6 < num_terms; lVar6 = lVar6 + 1) {
    local_3d8.data_._0_4_ = (local_3d0.data_)->type;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar_1,"indices[i]","it->var_index()",expected,(int *)&local_3d8);
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_3d8);
      pcVar5 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0x1a0,pcVar5);
      testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_3d8.data_ = (AssertHelperData *)(local_3d0.data_)->file;
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar_1,"coefs[i]","it->coef()",(double *)actual,(double *)&local_3d8
              );
    if (gtest_ar_1.success_ == false) {
      testing::Message::Message((Message *)&local_3d8);
      pcVar5 = "";
      if (gtest_ar_1.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
                 0x1a0,pcVar5);
      testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3d8);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_3d8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    local_3d0.data_ = (AssertHelperData *)&(local_3d0.data_)->line;
    actual = actual + 1;
    expected = expected + 1;
  }
  local_3d8.data_ =
       (AssertHelperData *)
       (*(long *)(*(long *)(gtest_ar._0_8_ + 0x228) + 0x10 +
                 (long)(int)gtest_ar.message_.ptr_ * 0x88) * 0x10 +
       *(long *)(*(long *)(gtest_ar._0_8_ + 0x228) + (long)(int)gtest_ar.message_.ptr_ * 0x88));
  testing::internal::
  CmpHelperEQ<gch::small_vector_iterator<mp::LinearExpr::Term*,long>,gch::small_vector_iterator<mp::LinearExpr::Term_const*,long>>
            ((internal *)&gtest_ar_1,"con.linear_expr().end()","it",
             (small_vector_iterator<mp::LinearExpr::Term_*,_long> *)&local_3d8,
             (small_vector_iterator<const_mp::LinearExpr::Term_*,_long> *)&local_3d0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_3d8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  local_3d0.data_._0_4_ = 1;
  local_3d8.data_._0_4_ =
       *(undefined4 *)
        (*(long *)(gtest_ar._0_8_ + 0x228) + 0x10 + (long)(int)gtest_ar.message_.ptr_ * 0x88);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"1","con.linear_expr().num_terms()",(int *)&local_3d0,
             (int *)&local_3d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_3d0);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x1a1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3d8,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_3d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_3d0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::algebraic_con(&p,0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&p);
  return;
}

Assistant:

TEST(ProblemTest, MutAlgebraicCon) {
  Problem p;
  p.AddCon(0, 0);
  EXPECT_EQ(1, p.num_algebraic_cons());
  Problem::MutAlgebraicCon con = p.algebraic_con(0);
  EXPECT_EQ(0, con.dual());
  con.set_dual(4.2);
  EXPECT_EQ(4.2 , con.dual());
  auto expr = p.MakeNumericConstant(42);
  con.set_nonlinear_expr(expr);
  EXPECT_EQ(expr, con.nonlinear_expr());
  con.linear_expr().AddTerm(11, 2.2);
  const int indices[] = {11};
  const double coefs[] = {2.2};
  con.set_lb(3.3);
  con.set_ub(4.4);
  EXPECT_EQ(3.3, con.lb());
  EXPECT_EQ(4.4, con.ub());
  EXPECT_LINEAR_EXPR(con.linear_expr(), indices, coefs);
  EXPECT_EQ(1, con.linear_expr().num_terms());
  const Problem &cp = p;
  Problem::AlgebraicCon ccon = cp.algebraic_con(0);
  ccon = con;
}